

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstral_analysis.h
# Opt level: O0

void __thiscall sptk::MelGeneralizedCepstralAnalysis::Buffer::~Buffer(Buffer *this)

{
  Buffer *in_RDI;
  
  ~Buffer(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Buffer() {
    }